

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mhitm.c
# Opt level: O3

long attk_protection(int aatyp)

{
  switch(aatyp) {
  case 0:
  case 10:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
    goto switchD_001c8b71_caseD_0;
  case 1:
  case 5:
    return 0x10;
  case 2:
  case 6:
  case 8:
  case 9:
  case 0xb:
    return 0;
  case 3:
    return 0x20;
  case 4:
    return 4;
  case 7:
    return 0x12;
  default:
    if (aatyp != 0xff) {
      if (aatyp == 0xfe) {
        return 0x10;
      }
      return 0;
    }
switchD_001c8b71_caseD_0:
    return -1;
  }
}

Assistant:

long attk_protection(int aatyp)
{
    long w_mask = 0L;

    switch (aatyp) {
    case AT_NONE:
    case AT_SPIT:
    case AT_EXPL:
    case AT_BOOM:
    case AT_GAZE:
    case AT_BREA:
    case AT_MAGC:
	w_mask = ~0L;		/* special case; no defense needed */
	break;
    case AT_CLAW:
    case AT_TUCH:
    case AT_WEAP:
	w_mask = W_ARMG;	/* caller needs to check for weapon */
	break;
    case AT_KICK:
	w_mask = W_ARMF;
	break;
    case AT_BUTT:
	w_mask = W_ARMH;
	break;
    case AT_HUGS:
	w_mask = (W_ARMC|W_ARMG); /* attacker needs both to be protected */
	break;
    case AT_BITE:
    case AT_STNG:
    case AT_ENGL:
    case AT_TENT:
    default:
	w_mask = 0L;		/* no defense available */
	break;
    }
    return w_mask;
}